

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O0

bool __thiscall
ObjectModelBuilder::buildBindingDependency
          (ObjectModelBuilder *this,Binding *binding,string *dep,Object *object,Class *clazz)

{
  bool bVar1;
  bool bVar2;
  __type _Var3;
  ostream *poVar4;
  vector<Property,_std::allocator<Property>_> *pvVar5;
  reference pPVar6;
  ulong uVar7;
  string local_1b8 [32];
  string local_198 [32];
  undefined1 local_178 [8];
  Property i_1;
  iterator __end3;
  iterator __begin3;
  vector<Property,_std::allocator<Property>_> *__range3;
  undefined1 local_110 [8];
  Property i;
  iterator __end2;
  iterator __begin2;
  vector<Property,_std::allocator<Property>_> *__range2;
  bool propertyInInstance;
  undefined1 local_a0 [8];
  Dependency d;
  size_t pos;
  string dependency;
  Class *clazz_local;
  Object *object_local;
  string *dep_local;
  Binding *binding_local;
  ObjectModelBuilder *this_local;
  
  dependency.field_2._8_8_ = clazz;
  string_trim((string *)&pos,dep);
  d.objectId.field_2._8_8_ = std::__cxx11::string::find((char *)&pos,0x14f006);
  Binding::Dependency::Dependency((Dependency *)local_a0);
  if (d.objectId.field_2._8_8_ == -1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"didn\'t find any match..");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    bVar2 = false;
    pvVar5 = &object->clazz->properties;
    __end2 = std::vector<Property,_std::allocator<Property>_>::begin(pvVar5);
    i.type.field_2._8_8_ = std::vector<Property,_std::allocator<Property>_>::end(pvVar5);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Property_*,_std::vector<Property,_std::allocator<Property>_>_>
                                       *)((long)&i.type.field_2 + 8)), bVar1) {
      pPVar6 = __gnu_cxx::
               __normal_iterator<Property_*,_std::vector<Property,_std::allocator<Property>_>_>::
               operator*(&__end2);
      Property::Property((Property *)local_110,pPVar6);
      poVar4 = std::operator<<((ostream *)&std::cout,"looking object, matching ");
      poVar4 = std::operator<<(poVar4,(string *)&i);
      poVar4 = std::operator<<(poVar4,(string *)&pos);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &i,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&pos);
      if (_Var3) {
        bVar2 = true;
        std::__cxx11::string::operator=
                  ((string *)(d.propertyName.field_2._M_local_buf + 8),(string *)&object->id);
        std::__cxx11::string::operator=((string *)local_a0,(string *)&pos);
      }
      Property::~Property((Property *)local_110);
      if (_Var3) break;
      __gnu_cxx::__normal_iterator<Property_*,_std::vector<Property,_std::allocator<Property>_>_>::
      operator++(&__end2);
    }
    if (!bVar2) {
      pvVar5 = (vector<Property,_std::allocator<Property>_> *)(dependency.field_2._8_8_ + 0x60);
      __end3 = std::vector<Property,_std::allocator<Property>_>::begin(pvVar5);
      i_1.type.field_2._8_8_ = std::vector<Property,_std::allocator<Property>_>::end(pvVar5);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Property_*,_std::vector<Property,_std::allocator<Property>_>_>
                                         *)((long)&i_1.type.field_2 + 8)), bVar2) {
        pPVar6 = __gnu_cxx::
                 __normal_iterator<Property_*,_std::vector<Property,_std::allocator<Property>_>_>::
                 operator*(&__end3);
        Property::Property((Property *)local_178,pPVar6);
        poVar4 = std::operator<<((ostream *)&std::cout,"looking class, matching ");
        poVar4 = std::operator<<(poVar4,(string *)&i_1);
        poVar4 = std::operator<<(poVar4,(string *)&pos);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&i_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&pos);
        if (_Var3) {
          std::__cxx11::string::operator=
                    ((string *)(d.propertyName.field_2._M_local_buf + 8),"this");
          std::__cxx11::string::operator=((string *)local_a0,(string *)&pos);
        }
        Property::~Property((Property *)local_178);
        if (_Var3) break;
        __gnu_cxx::__normal_iterator<Property_*,_std::vector<Property,_std::allocator<Property>_>_>
        ::operator++(&__end3);
      }
    }
  }
  else {
    std::__cxx11::string::substr((ulong)local_198,(ulong)&pos);
    std::__cxx11::string::operator=((string *)(d.propertyName.field_2._M_local_buf + 8),local_198);
    std::__cxx11::string::~string(local_198);
    std::__cxx11::string::substr((ulong)local_1b8,(ulong)&pos);
    std::__cxx11::string::operator=((string *)local_a0,local_1b8);
    std::__cxx11::string::~string(local_1b8);
  }
  uVar7 = std::__cxx11::string::empty();
  if (((uVar7 & 1) == 0) && (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) == 0)) {
    std::vector<Binding::Dependency,_std::allocator<Binding::Dependency>_>::push_back
              (&binding->dependencies,(value_type *)local_a0);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  Binding::Dependency::~Dependency((Dependency *)local_a0);
  std::__cxx11::string::~string((string *)&pos);
  return this_local._7_1_;
}

Assistant:

bool ObjectModelBuilder::buildBindingDependency(Binding *binding, const std::string &dep, Object *object, Class *clazz)
{
    // parse out "objectId->propertyName" and add as a Binding::Depencency to the Binding
    std::string dependency = string_trim(dep);
    size_t pos = dependency.find("->");

    Binding::Dependency d;

    // If we didn't find a ->, look in the class we're generating to see if the
    // binding matches that..
    if (pos == std::string::npos) {
        std::cout << "didn't find any match.." << std::endl;
        bool propertyInInstance = false;
        for (auto i : object->clazz->properties) {
            std::cout << "looking object, matching " << i.name << dependency << std::endl;
            if (i.name == dependency) {
                propertyInInstance = true;
                d.objectId = object->id;
                d.propertyName = dependency;
                break;
            }
        }
        if (!propertyInInstance) {
            for (auto i : clazz->properties) {
                std::cout << "looking class, matching " << i.name << dependency << std::endl;
                if (i.name == dependency) {
                    d.objectId = "this"; // refers to the instance of the class being generated
                    d.propertyName = dependency;
                    break;
                }
            }
        }
    } else {
        d.objectId = dependency.substr(0, pos);
        d.propertyName = dependency.substr(pos + 2);
    }
    if (d.objectId.empty() || d.propertyName.empty())
        return false;
    binding->dependencies.push_back(d);
    return true;
}